

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.hpp
# Opt level: O2

void __thiscall inja::Environment::Environment(Environment *this,path *input_path,path *output_path)

{
  _Rb_tree_header *p_Var1;
  
  FunctionStorage::FunctionStorage(&this->function_storage);
  (this->template_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->template_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->template_storage)._M_t._M_impl.super__Rb_tree_header;
  (this->template_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->template_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->template_storage)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  LexerConfig::LexerConfig(&this->lexer_config);
  (this->parser_config).search_included_templates_in_files = true;
  *(undefined8 *)&(this->parser_config).include_callback.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->parser_config).include_callback.super__Function_base._M_functor + 8)
       = 0;
  (this->parser_config).include_callback.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->parser_config).include_callback._M_invoker = (_Invoker_type)0x0;
  (this->render_config).throw_at_missing_includes = true;
  (this->render_config).html_autoescape = false;
  std::filesystem::__cxx11::path::path(&this->input_path,input_path);
  std::filesystem::__cxx11::path::path(&this->output_path,output_path);
  return;
}

Assistant:

Environment(const std::filesystem::path& input_path, const std::filesystem::path& output_path): input_path(input_path), output_path(output_path) {}